

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O2

size_t unescape(char *out,char *in,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  size_t sVar4;
  
  sVar4 = 0;
  uVar2 = 0;
  while (uVar2 < len) {
    cVar3 = in[uVar2];
    uVar1 = uVar2;
    if (cVar3 == '\\') {
      uVar1 = uVar2 + 1;
      cVar3 = in[uVar2 + 1];
      if ((cVar3 != '\"') && (cVar3 != '\\')) {
        if (cVar3 == 't') {
          cVar3 = '\t';
        }
        else if (cVar3 == 'f') {
          cVar3 = '\f';
        }
        else if (cVar3 == 'n') {
          cVar3 = '\n';
        }
        else if (cVar3 == 'r') {
          cVar3 = '\r';
        }
        else if (cVar3 == 'b') {
          cVar3 = '\b';
        }
        else {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                  ,0xce,"Unsupported escape sequence \\%c\n",(ulong)(uint)(int)cVar3);
          cVar3 = '\\';
          uVar1 = uVar2;
        }
      }
    }
    out[sVar4] = cVar3;
    sVar4 = sVar4 + 1;
    uVar2 = uVar1 + 1;
  }
  out[sVar4] = '\0';
  return sVar4;
}

Assistant:

size_t
unescape(char *out, const char *in, size_t len)
{
   char *ptr = out;
   size_t i;

   for (i = 0; i < len; ++i) {
      int c = in[i];
      if (c == '\\') {
          switch (in[i+1]) {
          case '"':  *ptr++ = '"'; i++; break;
          case '\\': *ptr++ = '\\'; i++; break;
          case 'b':  *ptr++ = '\b'; i++; break;
          case 'f':  *ptr++ = '\f'; i++; break;
          case 'n': *ptr++ = '\n'; i++; break;
          case 'r': *ptr++ = '\r'; i++; break;
          case 't': *ptr++ = '\t'; i++; break;
          default:
              E_WARN("Unsupported escape sequence \\%c\n", in[i+1]);
              *ptr++ = c;
          }
      }
      else {
          *ptr++ = c;
      }
   }
   *ptr = '\0';
   return ptr - out;
}